

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

char * Net_ID_Str(char *new_protoname,int new_instance)

{
  size_t sVar1;
  ulong uVar2;
  char *__s;
  ulong uVar3;
  
  sVar1 = strlen(new_protoname);
  uVar2 = (ulong)((int)sVar1 + 10);
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)uVar2) {
    uVar3 = uVar2;
  }
  __s = (char *)operator_new__(uVar3);
  sprintf(__s,"%s %d",new_protoname,new_instance);
  return __s;
}

Assistant:

char *
Net_ID_Str(const char *new_protoname, int new_instance)
{
  int plen, ilen;
  char *string;
  plen = strlen(new_protoname);
  ilen = 10; // should be log(new_instance)
  string = new char[ilen + plen];
  sprintf(string, "%s %d", new_protoname, new_instance);
  return string;
  /*
   * If strsteam works
   *
   ostrstream buffer;
   buffer << protoname <<" "<< instance;
   return buffer.str();
   */
}